

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>>
::redux<Eigen::internal::scalar_sum_op<float,float>>
          (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>>
           *this,scalar_sum_op<float,_float> *func)

{
  Scalar SVar1;
  ThisEvaluator thisEval;
  Data DStack_68;
  
  if (0 < *(long *)(this + 0x38)) {
    internal::
    binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
    ::Data::Data(&DStack_68,(XprType *)this);
    SVar1 = internal::
            redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const,-1,1,true>const>>,3,0>
            ::
            run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const>const,Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const,_1,1,true>const>>
                      ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>_>
                        *)&DStack_68,func,
                       (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_true>_>
                        *)this);
    return SVar1;
  }
  __assert_fail("this->rows()>0 && this->cols()>0 && \"you are using an empty matrix\"",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/3rdparty/eigen/Eigen/src/Core/Redux.h"
                ,0x19b,
                "typename internal::traits<Derived>::Scalar Eigen::DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, 1, -1, true>>, const Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1, true>>>::redux(const Func &) const [Derived = Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float>, const Eigen::Transpose<const Eigen::Block<const Eigen::Product<Eigen::Transpose<const Eigen::Matrix<float, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<float, -1, 1>>, 1>, 1, -1, true>>, const Eigen::Block<const Eigen::Block<const Eigen::Matrix<float, -1, -1>, -1, 1, true>, -1, 1, true>>, BinaryOp = Eigen::internal::scalar_sum_op<float>]"
               );
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}